

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint8_t __thiscall AmpIO::GetEncoderChannelB(AmpIO *this)

{
  uint32_t uVar1;
  uint i;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x44514c41) {
    bVar3 = 0;
    for (uVar2 = 0; this->NumEncoders != uVar2; uVar2 = uVar2 + 1) {
      bVar3 = (byte)(1 << ((byte)uVar2 & 0x1f)) &
              (char)(*(char *)((long)this->ReadBuffer +
                              (ulong)(this->ENC_POS_OFFSET + (int)uVar2) * 4 + 3) << 2) >> 7 | bVar3
      ;
    }
  }
  else {
    bVar3 = (byte)(this->ReadBuffer[2] >> 0x14) & 0xf;
  }
  return bVar3;
}

Assistant:

uint8_t AmpIO::GetEncoderChannelB(void) const
{
    uint8_t encB;
    if (GetHardwareVersion() == DQLA_String) {
        // This also works for QLA with Rev 8+
        encB = 0;
        for (unsigned int i = 0; i < NumEncoders; i++) {
            if (ReadBuffer[ENC_POS_OFFSET+i]&ENC_B_MASK)
                encB |= (1 << i);
        }
    }
    else {
        encB =  static_cast<uint8_t>((this->GetDigitalInput()&0x00f00000)>>20);
    }
    return encB;
}